

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

void store_helper(CPUArchState_conflict30 *env,target_ulong_conflict addr,uint64_t val,
                 TCGMemOpIdx oi,uintptr_t retaddr,MemOp op)

{
  int iVar1;
  uc_struct *uc;
  void *pvVar2;
  long lVar3;
  char cVar4;
  _Bool _Var5;
  uint *puVar6;
  MemoryRegion *current;
  MemoryRegion_conflict *pMVar7;
  uint size;
  long lVar8;
  byte bVar9;
  list_item *plVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  CPUIOTLBEntry *iotlbentry;
  ulong uVar16;
  ulong uVar17;
  uint mmu_idx;
  uint page;
  ulong uVar18;
  MemOp in_stack_00000008;
  CPUTriCoreState *__mptr;
  uint local_70;
  uint local_58;
  MemOp local_50;
  ulong len;
  size_t index;
  
  mmu_idx = oi & 0xf;
  uVar17 = (ulong)mmu_idx;
  uVar18 = (ulong)(mmu_idx << 4);
  uVar13 = addr >> 0xe;
  uVar14 = *(uint *)((long)env->gpr_a + (uVar18 - 0x40)) >> 6 & uVar13;
  index = (size_t)uVar14;
  lVar8 = *(long *)((long)env->gpr_a + (uVar18 - 0x38));
  uVar16 = (ulong)(uVar14 << 6);
  uVar14 = oi >> 4 & 0x70;
  if (uVar14 != 0) {
    if (uVar14 == 0x70) {
      uVar14 = oi >> 4 & 3;
    }
    else {
      uVar14 = uVar14 >> 4;
    }
  }
  local_50 = op & MO_64;
  size = 1 << ((byte)op & 3);
  len = (ulong)size;
  uc = (uc_struct *)env->uc;
  local_70 = *(uint *)(lVar8 + 4 + uVar16);
  if ((~(-1 << ((byte)uVar14 & 0x1f)) & addr) != 0) {
    (**(code **)(*(long *)&env[-4].end_reset_fields + 0x18))
              (&env[-0x32].cpu_model,addr,1,uVar17,retaddr);
  }
  puVar6 = (uint *)((long)env->gpr_a + (uVar18 - 0x40));
  lVar8 = lVar8 + uVar16;
  local_58 = addr & 0xffffc000;
  if ((local_70 & 0xffffe000) != (addr & 0xffffc000)) {
    _Var5 = victim_tlb_hit(env,uVar17,index,4,addr & 0xffffc000);
    if (!_Var5) {
      cVar4 = (**(code **)(*(long *)&env[-4].end_reset_fields + 0x48))
                        (&env[-0x32].cpu_model,addr,len,1,uVar17,0,retaddr);
      if (cVar4 == '\0') goto LAB_00d13458;
      uVar14 = uVar13 & *puVar6 >> 6;
      index = (size_t)uVar14;
      lVar8 = (ulong)(uVar14 << 6) + *(long *)((long)env->gpr_a + (uVar18 - 0x38));
    }
    local_70 = *(uint *)(lVar8 + 4) & 0xffffdfff;
  }
  uVar14 = addr & 0x3fff;
  uVar16 = (ulong)(*(uint *)(lVar8 + 0xc) | uVar14);
  current = (*uc->memory_mapping)(uc,uVar16);
  if (uc->size_recur_mem == 0) {
    plVar10 = uc->hook[0xb].head;
    while (((plVar10 != (list_item *)0x0 && (pvVar2 = plVar10->data, pvVar2 != (void *)0x0)) &&
           ((*(char *)((long)pvVar2 + 0x14) != '\0' ||
            ((*(ulong *)((long)pvVar2 + 0x18) <= *(ulong *)((long)pvVar2 + 0x20) &&
              (*(ulong *)((long)pvVar2 + 0x20) < uVar16 || uVar16 < *(ulong *)((long)pvVar2 + 0x18))
             || ((**(code **)((long)pvVar2 + 0x28))(uc,0x11,uVar16,len,val),
                uc->stop_request == false))))))) {
      plVar10 = plVar10->next;
    }
  }
  if (current == (MemoryRegion *)0x0) {
    for (plVar10 = uc->hook[5].head;
        (plVar10 != (list_item *)0x0 && (pvVar2 = plVar10->data, pvVar2 != (void *)0x0));
        plVar10 = plVar10->next) {
      if ((*(char *)((long)pvVar2 + 0x14) == '\0') &&
         (*(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18) ||
          uVar16 <= *(ulong *)((long)pvVar2 + 0x20) && *(ulong *)((long)pvVar2 + 0x18) <= uVar16)) {
        cVar4 = (**(code **)((long)pvVar2 + 0x28))(uc,0x14,uVar16,len,val);
        if (cVar4 != '\0') {
          uc->invalid_error = 0;
          if ((local_70 & 0xffffe000) != local_58) {
            _Var5 = victim_tlb_hit(env,uVar17,index,4,local_58);
            if (!_Var5) {
              cVar4 = (**(code **)(*(long *)&env[-4].end_reset_fields + 0x48))
                                (&env[-0x32].cpu_model,addr,len,1,uVar17,0,retaddr);
              if (cVar4 == '\0') goto LAB_00d13458;
              uVar15 = uVar13 & *puVar6 >> 6;
              index = (size_t)uVar15;
              lVar8 = (ulong)(uVar15 << 6) + *(long *)((long)env->gpr_a + (uVar18 - 0x38));
            }
            local_70 = *(uint *)(lVar8 + 4) & 0xffffdfff;
          }
          uVar16 = (ulong)(*(uint *)(lVar8 + 0xc) | uVar14);
          current = (*uc->memory_mapping)(uc,uVar16);
          if (current != (MemoryRegion *)0x0) goto LAB_00d12d2b;
          uc->invalid_error = 0xb;
          goto LAB_00d12fee;
        }
        if (uc->stop_request != false) break;
      }
    }
    uc->invalid_addr = uVar16;
    uc->invalid_error = 7;
  }
  else {
LAB_00d12d2b:
    if ((current->perms & 2) != 0) {
LAB_00d12ed9:
      uVar15 = (uint)index;
      if (((uc->snapshot_level != 0) && (current->ram == true)) &&
         (current->priority < uc->snapshot_level)) {
        pMVar7 = memory_cow_tricore((uc_struct_conflict15 *)uc,(MemoryRegion_conflict *)current,
                                    (ulong)addr & 0xffffc000,0x4000);
        if (pMVar7 == (MemoryRegion_conflict *)0x0) {
          uc->invalid_addr = uVar16;
          uc->invalid_error = 1;
          goto LAB_00d12fee;
        }
        cVar4 = (**(code **)(*(long *)&env[-4].end_reset_fields + 0x48))
                          (&env[-0x32].cpu_model,uVar16,len,1,uVar17,0,retaddr);
        if (cVar4 == '\0') {
LAB_00d13458:
          __assert_fail("ok",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                        ,0x3c7,
                        "void tlb_fill(CPUState *, target_ulong, int, MMUAccessType, int, uintptr_t)"
                       );
        }
        uVar15 = uVar13 & *puVar6 >> 6;
        lVar3 = *(long *)((long)env->gpr_a + (uVar18 - 0x38));
        lVar8 = lVar3 + (ulong)(uVar15 << 6);
        local_70 = *(uint *)(lVar3 + 4 + (ulong)(uVar15 << 6));
      }
      uVar13 = (uint)val;
      if ((local_70 & 0x3fff) == 0) {
        if ((local_50 == MO_8) || (0xffffffffffffbfff < (ulong)(uVar14 + size) - 0x4001)) {
          if (MO_BEQ < op) {
            return;
          }
          uVar16 = (ulong)addr;
          lVar8 = *(long *)(lVar8 + 0x10);
          switch(op) {
          case MO_8:
            *(char *)(lVar8 + uVar16) = (char)val;
            return;
          default:
            return;
          case MO_BEUW:
            val = (uint64_t)(ushort)((ushort)val << 8 | (ushort)val >> 8);
          case MO_16:
            *(short *)(lVar8 + uVar16) = (short)val;
            return;
          case MO_BEUL:
            val = (uint64_t)
                  (uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                  uVar13 << 0x18);
          case MO_32:
            *(int *)(lVar8 + uVar16) = (int)val;
            return;
          case MO_BEQ:
            val = val >> 0x38 | (val & 0xff000000000000) >> 0x28 | (val & 0xff0000000000) >> 0x18 |
                  (val & 0xff00000000) >> 8 | (val & 0xff000000) << 8 | (val & 0xff0000) << 0x18 |
                  (val & 0xff00) << 0x28 | val << 0x38;
          case MO_64:
            *(uint64_t *)(lVar8 + uVar16) = val;
            return;
          }
        }
      }
      else {
        uVar16 = (ulong)addr;
        if ((size - 1 & addr) == 0) {
          iotlbentry = (CPUIOTLBEntry *)
                       (*(long *)((long)env + uVar17 * 0x2b0 + -0x5a8) + (ulong)(uVar15 << 4));
          if ((local_70 >> 10 & 1) != 0) {
            cpu_check_watchpoint_tricore
                      ((CPUState *)&env[-0x32].cpu_model,uVar16,len,iotlbentry->attrs,2,retaddr);
          }
          bVar9 = (byte)(local_70 >> 9) & 1 & local_50 != MO_8;
          if ((local_70 >> 0xb & 1) == 0) {
            if ((local_70 >> 8 & 1) != 0) {
              return;
            }
            if ((local_70 >> 0xc & 1) != 0) {
              notdirty_write((CPUState *)&env[-0x32].cpu_model,uVar16,size,
                             (CPUIOTLBEntry *)iotlbentry->addr,retaddr);
            }
            if (bVar9 != 0) {
              op = op ^ MO_BE;
            }
            store_memop((void *)(uVar16 + *(long *)(lVar8 + 0x10)),val,op);
            return;
          }
          io_writex(env,iotlbentry,uVar13,(ulong)addr,(target_ulong_conflict)retaddr,
                    (ulong)((uint)bVar9 << 3 ^ op),in_stack_00000008);
          return;
        }
      }
      uVar16 = len + addr;
      uVar11 = (uint)uVar16;
      page = uVar11 & 0xffffc000;
      uVar14 = uVar11 & 0x3fff;
      uVar12 = (uint)(uVar16 >> 0xe) & 0x3ffff;
      local_50 = *puVar6 >> 6 & uVar12;
      lVar8 = *(long *)((long)env->gpr_a + (uVar18 - 0x38));
      uVar13 = *(uint *)(lVar8 + 4 + (ulong)(local_50 << 6));
      if ((uVar13 & 0xffffe000) != page) {
        _Var5 = victim_tlb_hit(env,uVar17,(ulong)local_50,4,page);
        if (_Var5) {
          lVar8 = lVar8 + (ulong)(local_50 << 6);
        }
        else {
          tlb_fill((CPUState *)&env[-0x32].cpu_model,page,uVar14,MMU_DATA_STORE,mmu_idx,retaddr);
          local_50 = uVar12 & *puVar6 >> 6;
          lVar8 = (ulong)(local_50 << 6) + *(long *)((long)env->gpr_a + (uVar18 - 0x38));
        }
        uVar13 = *(uint *)(lVar8 + 4);
      }
      if ((local_70 >> 10 & 1) != 0) {
        cpu_check_watchpoint_tricore
                  ((CPUState *)&env[-0x32].cpu_model,(ulong)addr,len - uVar14,
                   *(MemTxAttrs *)
                    (*(long *)((long)env + uVar17 * 0x2b0 + -0x5a8) + 8 + (ulong)(uVar15 << 4)),2,
                   retaddr);
      }
      if ((uVar13 >> 10 & 1) != 0) {
        cpu_check_watchpoint_tricore
                  ((CPUState *)&env[-0x32].cpu_model,(ulong)(uVar11 & 0xffffc000),(ulong)uVar14,
                   *(MemTxAttrs *)
                    (*(long *)((long)env + uVar17 * 0x2b0 + -0x5a8) + 8 + (ulong)(local_50 << 4)),2,
                   retaddr);
      }
      iVar1 = uc->size_recur_mem;
      uc->size_recur_mem = size;
      uVar17 = 0;
      uVar16 = (ulong)(size * 8);
      do {
        uVar16 = uVar16 - 8;
        bVar9 = (byte)uVar16;
        if ((op & MO_BE) == MO_8) {
          bVar9 = (byte)uVar17;
        }
        store_helper(env,addr,val >> (bVar9 & 0x3f) & 0xff,oi,retaddr,MO_8);
        addr = addr + 1;
        uVar17 = uVar17 + 8;
      } while (size * 8 != uVar17);
      uc->size_recur_mem = iVar1;
      return;
    }
    for (plVar10 = uc->hook[8].head;
        (plVar10 != (list_item *)0x0 && (pvVar2 = plVar10->data, pvVar2 != (void *)0x0));
        plVar10 = plVar10->next) {
      if ((*(char *)((long)pvVar2 + 0x14) == '\0') &&
         (*(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18) ||
          uVar16 <= *(ulong *)((long)pvVar2 + 0x20) && *(ulong *)((long)pvVar2 + 0x18) <= uVar16)) {
        cVar4 = (**(code **)((long)pvVar2 + 0x28))(uc,0x16,uVar16,len,val);
        if (cVar4 != '\0') {
          if ((local_70 & 0xffffe000) != local_58) {
            _Var5 = victim_tlb_hit(env,uVar17,index,4,local_58);
            if (!_Var5) {
              cVar4 = (**(code **)(*(long *)&env[-4].end_reset_fields + 0x48))
                                (&env[-0x32].cpu_model,addr,len,1,uVar17,0,retaddr);
              if (cVar4 == '\0') goto LAB_00d13458;
              uVar15 = uVar13 & *puVar6 >> 6;
              index = (size_t)uVar15;
              lVar8 = (ulong)(uVar15 << 6) + *(long *)((long)env->gpr_a + (uVar18 - 0x38));
            }
            local_70 = *(uint *)(lVar8 + 4) & 0xffffdfff;
          }
          uc->invalid_error = 0;
          goto LAB_00d12ed9;
        }
        if (uc->stop_request != false) break;
      }
    }
    uc->invalid_addr = uVar16;
    uc->invalid_error = 0xc;
  }
LAB_00d12fee:
  cpu_exit(uc->cpu);
  return;
}

Assistant:

static void inline
store_helper(CPUArchState *env, target_ulong addr, uint64_t val,
             TCGMemOpIdx oi, uintptr_t retaddr, MemOp op)
{
    struct uc_struct *uc = env->uc;
    HOOK_FOREACH_VAR_DECLARE;
    uintptr_t mmu_idx = get_mmuidx(oi);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr = tlb_addr_write(entry);
    target_ulong paddr;
    const size_t tlb_off = offsetof(CPUTLBEntry, addr_write);
    unsigned a_bits = get_alignment_bits(get_memop(oi));
    void *haddr;
    size_t size = memop_size(op);
    struct hook *hook;
    bool handled;
    MemoryRegion *mr;

    /* Handle CPU specific unaligned behaviour */
    if (addr & ((1 << a_bits) - 1)) {
        cpu_unaligned_access(env_cpu(env), addr, MMU_DATA_STORE,
                             mmu_idx, retaddr);
    }

    /* If the TLB entry is for a different page, reload and try again.  */
    if (!tlb_hit(env->uc, tlb_addr, addr)) {
        if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
            addr & TARGET_PAGE_MASK)) {
            tlb_fill(env_cpu(env), addr, size, MMU_DATA_STORE,
                     mmu_idx, retaddr);
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = tlb_addr_write(entry) & ~TLB_INVALID_MASK;
    }

    // Load the latest memory mapping.
    paddr = entry->paddr | (addr & ~TARGET_PAGE_MASK);
    mr = uc->memory_mapping(uc, paddr);

    if (!uc->size_recur_mem) { // disabling write callback if in recursive call
        // Unicorn: callback on memory write
        HOOK_FOREACH(uc, hook, UC_HOOK_MEM_WRITE) {
            if (hook->to_delete)
                continue;
            if (!HOOK_BOUND_CHECK(hook, paddr))
                continue;
            ((uc_cb_hookmem_t)hook->callback)(uc, UC_MEM_WRITE, paddr, size, val, hook->user_data);

            // the last callback may already asked to stop emulation
            if (uc->stop_request)
                break;
        }
    }

    // Unicorn: callback on invalid memory
    if (mr == NULL) {
        handled = false;
        HOOK_FOREACH(uc, hook, UC_HOOK_MEM_WRITE_UNMAPPED) {
            if (hook->to_delete)
                continue;
            if (!HOOK_BOUND_CHECK(hook, paddr))
                continue;
            if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_WRITE_UNMAPPED, paddr, size, val, hook->user_data)))
                break;

            // the last callback may already asked to stop emulation
            if (uc->stop_request)
                break;
        }

        if (!handled) {
            // save error & quit
            uc->invalid_addr = paddr;
            uc->invalid_error = UC_ERR_WRITE_UNMAPPED;
            // printf("***** Invalid memory write at " TARGET_FMT_lx "\n", addr);
            cpu_exit(uc->cpu);
            return;
        } else {
            uc->invalid_error = UC_ERR_OK;
            /* If the TLB entry is for a different page, reload and try again.  */
            if (!tlb_hit(env->uc, tlb_addr, addr)) {
                if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                    addr & TARGET_PAGE_MASK)) {
                    tlb_fill(env_cpu(env), addr, size, MMU_DATA_STORE,
                             mmu_idx, retaddr);
                    index = tlb_index(env, mmu_idx, addr);
                    entry = tlb_entry(env, mmu_idx, addr);
                }
                tlb_addr = tlb_addr_write(entry) & ~TLB_INVALID_MASK;
            }
            paddr = entry->paddr | (addr & ~TARGET_PAGE_MASK);
            mr = uc->memory_mapping(uc, paddr);
            if (mr == NULL) {
                uc->invalid_error = UC_ERR_MAP;
                cpu_exit(uc->cpu);
                return;
            }
        }
    }

    // Unicorn: callback on non-writable memory
    if (mr != NULL && !(mr->perms & UC_PROT_WRITE)) {  //non-writable
        // printf("not writable memory???\n");
        handled = false;
        HOOK_FOREACH(uc, hook, UC_HOOK_MEM_WRITE_PROT) {
            if (hook->to_delete)
                continue;
            if (!HOOK_BOUND_CHECK(hook, paddr))
                continue;
            if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_WRITE_PROT, paddr, size, val, hook->user_data)))
                break;

            // the last callback may already asked to stop emulation
            if (uc->stop_request)
                break;
        }

        if (handled) {
            /* If the TLB entry is for a different page, reload and try again.  */
            if (!tlb_hit(env->uc, tlb_addr, addr)) {
                if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                    addr & TARGET_PAGE_MASK)) {
                    tlb_fill(env_cpu(env), addr, size, MMU_DATA_STORE,
                             mmu_idx, retaddr);
                    index = tlb_index(env, mmu_idx, addr);
                    entry = tlb_entry(env, mmu_idx, addr);
                }
                tlb_addr = tlb_addr_write(entry) & ~TLB_INVALID_MASK;
            }
            uc->invalid_error = UC_ERR_OK;
        } else {
            uc->invalid_addr = paddr;
            uc->invalid_error = UC_ERR_WRITE_PROT;
            // printf("***** Invalid memory write (ro) at " TARGET_FMT_lx "\n", addr);
            cpu_exit(uc->cpu);
            return;
        }
    }

    if (uc->snapshot_level && mr->ram && mr->priority < uc->snapshot_level) {
        mr = memory_cow(uc, mr, addr & TARGET_PAGE_MASK, TARGET_PAGE_SIZE);
        if (!mr) {
            uc->invalid_addr = paddr;
            uc->invalid_error = UC_ERR_NOMEM;
            cpu_exit(uc->cpu);
            return;
        }
        /* refill tlb after CoW */
        tlb_fill(env_cpu(env), paddr, size, MMU_DATA_STORE,
                 mmu_idx, retaddr);
        index = tlb_index(env, mmu_idx, addr);
        entry = tlb_entry(env, mmu_idx, addr);
        tlb_addr = tlb_addr_write(entry);
    }

    /* Handle anything that isn't just a straight memory access.  */
    if (unlikely(tlb_addr & ~TARGET_PAGE_MASK)) {
        CPUIOTLBEntry *iotlbentry;
        bool need_swap;

        /* For anything that is unaligned, recurse through byte stores.  */
        if ((addr & (size - 1)) != 0) {
            goto do_unaligned_access;
        }

        iotlbentry = &env_tlb(env)->d[mmu_idx].iotlb[index];

        /* Handle watchpoints.  */
        if (unlikely(tlb_addr & TLB_WATCHPOINT)) {
            /* On watchpoint hit, this will longjmp out.  */
            cpu_check_watchpoint(env_cpu(env), addr, size,
                                 iotlbentry->attrs, BP_MEM_WRITE, retaddr);
        }

        need_swap = size > 1 && (tlb_addr & TLB_BSWAP);

        /* Handle I/O access.  */
        if (tlb_addr & TLB_MMIO) {
            io_writex(env, iotlbentry, mmu_idx, val, addr, retaddr,
                      op ^ (need_swap * MO_BSWAP));
            return;
        }

        /* Ignore writes to ROM.  */
        if (unlikely(tlb_addr & TLB_DISCARD_WRITE)) {
            return;
        }

        /* Handle clean RAM pages.  */
        if (tlb_addr & TLB_NOTDIRTY) {
            notdirty_write(env_cpu(env), addr, size, iotlbentry, retaddr);
        }

        haddr = (void *)((uintptr_t)addr + entry->addend);

        /*
         * Keep these two store_memop separate to ensure that the compiler
         * is able to fold the entire function to a single instruction.
         * There is a build-time assert inside to remind you of this.  ;-)
         */
        if (unlikely(need_swap)) {
            store_memop(haddr, val, op ^ MO_BSWAP);
        } else {
            store_memop(haddr, val, op);
        }
        return;
    }

    /* Handle slow unaligned access (it spans two pages or IO).  */
    if (size > 1
        && unlikely((addr & ~TARGET_PAGE_MASK) + size - 1
                     >= TARGET_PAGE_SIZE)) {
        int i;
        uintptr_t index2;
        CPUTLBEntry *entry2;
        target_ulong page2, tlb_addr2;
        size_t size2;
        int old_size;

    do_unaligned_access:
        /*
         * Ensure the second page is in the TLB.  Note that the first page
         * is already guaranteed to be filled, and that the second page
         * cannot evict the first.
         */
        page2 = (addr + size) & TARGET_PAGE_MASK;
        size2 = (addr + size) & ~TARGET_PAGE_MASK;
        index2 = tlb_index(env, mmu_idx, page2);
        entry2 = tlb_entry(env, mmu_idx, page2);
        tlb_addr2 = tlb_addr_write(entry2);
        if (!tlb_hit_page(uc, tlb_addr2, page2)) {
            if (!victim_tlb_hit(env, mmu_idx, index2, tlb_off, page2)) {
                tlb_fill(env_cpu(env), page2, size2, MMU_DATA_STORE,
                         mmu_idx, retaddr);
                index2 = tlb_index(env, mmu_idx, page2);
                entry2 = tlb_entry(env, mmu_idx, page2);
            }
            tlb_addr2 = tlb_addr_write(entry2);
        }

        /*
         * Handle watchpoints.  Since this may trap, all checks
         * must happen before any store.
         */
        if (unlikely(tlb_addr & TLB_WATCHPOINT)) {
            cpu_check_watchpoint(env_cpu(env), addr, size - size2,
                                 env_tlb(env)->d[mmu_idx].iotlb[index].attrs,
                                 BP_MEM_WRITE, retaddr);
        }
        if (unlikely(tlb_addr2 & TLB_WATCHPOINT)) {
            cpu_check_watchpoint(env_cpu(env), page2, size2,
                                 env_tlb(env)->d[mmu_idx].iotlb[index2].attrs,
                                 BP_MEM_WRITE, retaddr);
        }

        /*
         * XXX: not efficient, but simple.
         * This loop must go in the forward direction to avoid issues
         * with self-modifying code in Windows 64-bit.
         */
        old_size = uc->size_recur_mem;
        uc->size_recur_mem = size;
        for (i = 0; i < size; ++i) {
            uint8_t val8;
            if (memop_big_endian(op)) {
                /* Big-endian extract.  */
                val8 = val >> (((size - 1) * 8) - (i * 8));
            } else {
                /* Little-endian extract.  */
                val8 = val >> (i * 8);
            }
            helper_ret_stb_mmu(env, addr + i, val8, oi, retaddr);
        }
        uc->size_recur_mem = old_size;
        return;
    }

    haddr = (void *)((uintptr_t)addr + entry->addend);
    store_memop(haddr, val, op);
}